

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator<QHashPrivate::Node<QSimplexVariable_*,_double>_> __thiscall
QHashPrivate::iterator<QHashPrivate::Node<QSimplexVariable_*,_double>_>::operator++
          (iterator<QHashPrivate::Node<QSimplexVariable_*,_double>_> *this)

{
  bool bVar1;
  Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *pDVar2;
  size_t sVar3;
  iterator<QHashPrivate::Node<QSimplexVariable_*,_double>_> iVar4;
  
  do {
    sVar3 = this->bucket + 1;
    this->bucket = sVar3;
    if (sVar3 == this->d->numBuckets) {
      this->d = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0;
      this->bucket = 0;
      sVar3 = 0;
      pDVar2 = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0;
      goto LAB_005624af;
    }
    bVar1 = isUnused(this);
  } while (bVar1);
  pDVar2 = this->d;
  sVar3 = this->bucket;
LAB_005624af:
  iVar4.bucket = sVar3;
  iVar4.d = pDVar2;
  return iVar4;
}

Assistant:

iterator operator++() noexcept
    {
        while (true) {
            ++bucket;
            if (bucket == d->numBuckets) {
                d = nullptr;
                bucket = 0;
                break;
            }
            if (!isUnused())
                break;
        }
        return *this;
    }